

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O0

Path * __thiscall
tinyusdz::Path::append_property(Path *__return_storage_ptr__,Path *this,string *elem)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  Path *p;
  string *elem_local;
  Path *this_local;
  
  uVar2 = ::std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    bVar1 = is_variantElementName(elem);
    if (bVar1) {
      this->_valid = false;
      Path(__return_storage_ptr__,this);
    }
    else {
      pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)elem);
      if (*pcVar3 == '[') {
        this->_valid = false;
        Path(__return_storage_ptr__,this);
      }
      else {
        pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)elem);
        if (*pcVar3 == '.') {
          this->_valid = false;
          Path(__return_storage_ptr__,this);
        }
        else {
          ::std::__cxx11::string::operator=((string *)&this->_prop_part,(string *)elem);
          ::std::__cxx11::string::operator=((string *)&this->_element,(string *)elem);
          Path(__return_storage_ptr__,this);
        }
      }
    }
  }
  else {
    this->_valid = false;
    Path(__return_storage_ptr__,this);
  }
  return __return_storage_ptr__;
}

Assistant:

Path Path::append_property(const std::string &elem) {
  Path &p = (*this);

  if (elem.empty()) {
    p._valid = false;
    return p;
  }

  if (is_variantElementName(elem)) {
    // variant chars are not supported yet.
    p._valid = false;
    return p;
  }

  if (elem[0] == '[') {
    // relational attrib are not supported
    p._valid = false;
    return p;
  } else if (elem[0] == '.') {
    // Relative
    // std::cerr << "???. elem[0] is '.'\n";
    // For a while, make this valid.
    p._valid = false;
    return p;
  } else {
    // TODO: Validate property path.
    p._prop_part = elem;
    p._element = elem;

    return p;
  }
}